

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# observer.hpp
# Opt level: O2

size_t __thiscall tf::TFProfObserver::num_tasks(TFProfObserver *this)

{
  pointer pvVar1;
  long lVar2;
  long lVar3;
  long *plVar4;
  size_t sVar5;
  size_t w;
  long lVar6;
  bool bVar7;
  
  pvVar1 = (this->_timeline).segments.
           super__Vector_base<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>,_std::allocator<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  sVar5 = 0;
  for (lVar6 = 0;
      lVar6 != ((long)(this->_timeline).segments.
                      super__Vector_base<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>,_std::allocator<std::vector<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1) / 0x18;
      lVar6 = lVar6 + 1) {
    lVar2 = *(long *)&pvVar1[lVar6].
                      super__Vector_base<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>
                      ._M_impl.super__Vector_impl_data;
    lVar3 = ((long)*(pointer *)
                    ((long)&pvVar1[lVar6].
                            super__Vector_base<std::vector<tf::Segment,_std::allocator<tf::Segment>_>,_std::allocator<std::vector<tf::Segment,_std::allocator<tf::Segment>_>_>_>
                            ._M_impl.super__Vector_impl_data + 8) - lVar2) / 0x18;
    plVar4 = (long *)(lVar2 + 8);
    while (bVar7 = lVar3 != 0, lVar3 = lVar3 + -1, bVar7) {
      sVar5 = sVar5 + (*plVar4 - plVar4[-1]) / 0x38;
      plVar4 = plVar4 + 3;
    }
  }
  return sVar5;
}

Assistant:

inline size_t TFProfObserver::num_tasks() const {
  size_t s = 0;
  for(size_t w=0; w<_timeline.segments.size(); ++w) {
    for(size_t l=0; l<_timeline.segments[w].size(); ++l) {
      s += _timeline.segments[w][l].size();
    }
  }
  return s;
}